

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O1

void __thiscall
DenseHashMapMoveTest_EmplaceHint_Test::TestBody(DenseHashMapMoveTest_EmplaceHint_Test *this)

{
  const_iterator hint;
  const_iterator hint_00;
  const_iterator hint_01;
  const_iterator hint_02;
  const_iterator hint_03;
  const_iterator hint_04;
  size_type sVar1;
  value_type *pvVar2;
  pair<const_int,_int> pVar3;
  char *in_R9;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  pointer ppStack_d0;
  pointer local_c8;
  iterator local_b8;
  AssertHelper local_98;
  pointer local_90;
  string local_88;
  int local_64 [3];
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_58;
  
  local_58.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  local_58.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  local_58.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  local_58.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  local_58.num_deleted = 0;
  local_58.num_elements = 0;
  local_58.num_buckets = 0x20;
  local_58.table = (pointer)0x0;
  local_58.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  local_58.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  local_58.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       true;
  local_58.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = false;
  local_58.key_info.delkey = 0;
  local_58.key_info.empty_key = 0;
  local_58.table = (pointer)malloc(0x100);
  memset(local_58.table,0,0x100);
  local_88._M_dataplus._M_p._0_4_ = 1;
  pvVar2 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_58,(int *)&local_88);
  pvVar2->second = 1;
  local_88._M_dataplus._M_p._0_4_ = 3;
  pvVar2 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_58,(int *)&local_88);
  pvVar2->second = 3;
  local_88._M_dataplus._M_p._0_4_ = 5;
  pvVar2 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_58,(int *)&local_88);
  pvVar2->second = 5;
  local_64[0] = 1;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::find<int>(&local_b8,&local_58,local_64);
  local_64[2] = 1;
  local_64[1] = 0;
  local_d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(local_b8.ht._4_4_,(uint)local_b8.ht);
  ppStack_d0 = local_b8.pos;
  local_c8 = local_b8.end;
  hint.pos = local_b8.pos;
  hint.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)local_d8._M_head_impl;
  hint.end = local_b8.end;
  google::
  dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
  ::emplace_hint<int,int,int>
            ((type *)&local_88,
             (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
              *)&local_58,hint,local_64 + 2,local_64 + 1);
  local_98.data_._0_1_ = (internal)(local_88.field_2._M_local_buf[8] ^ 1);
  local_90 = (pointer)0x0;
  if (local_88.field_2._M_local_buf[8] == 0) {
    local_64[0] = 3;
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>(&local_b8,&local_58,local_64);
    local_64[2] = 1;
    local_64[1] = 0;
    local_d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(local_b8.ht._4_4_,(uint)local_b8.ht);
    ppStack_d0 = local_b8.pos;
    local_c8 = local_b8.end;
    hint_00.pos = local_b8.pos;
    hint_00.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *)local_d8._M_head_impl;
    hint_00.end = local_b8.end;
    google::
    dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
    ::emplace_hint<int,int,int>
              ((type *)&local_88,
               (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                *)&local_58,hint_00,local_64 + 2,local_64 + 1);
    local_98.data_._0_1_ = (internal)(local_88.field_2._M_local_buf[8] ^ 1);
    local_90 = (pointer)0x0;
    if (local_88.field_2._M_local_buf[8] == 0) {
      ppStack_d0 = local_58.table + local_58.num_buckets;
      local_98.data_._0_1_ = (internal)0x1;
      local_98.data_._1_3_ = 0;
      local_64[0] = 0;
      hint_01.pos = ppStack_d0;
      hint_01.ht = &local_58;
      hint_01.end = ppStack_d0;
      local_d8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
      local_c8 = ppStack_d0;
      google::
      dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
      ::emplace_hint<int,int,int>
                ((type *)&local_88,
                 (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                  *)&local_58,hint_01,(int *)&local_98,local_64);
      local_b8.ht._0_4_ = CONCAT31(local_b8.ht._1_3_,local_88.field_2._M_local_buf[8]) ^ 1;
      local_b8.pos = (pointer)0x0;
      if (local_88.field_2._M_local_buf[8] != 0) {
        testing::Message::Message((Message *)&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_88,(internal *)&local_b8,
                   (AssertionResult *)"h.emplace_hint(h.end(), 1, 0).second","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x4d,(char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                          local_88._M_dataplus._M_p._0_4_));
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
LAB_00a4bf97:
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) !=
            &local_88.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_))
          ;
        }
        local_88._M_string_length = (size_type)local_b8.pos;
        if ((dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)local_d8._M_head_impl !=
            (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)0x0) {
          (**(code **)(*(long *)local_d8._M_head_impl + 8))();
          local_88._M_string_length = (size_type)local_b8.pos;
        }
        goto LAB_00a4be84;
      }
      local_d8._M_head_impl._0_4_ = 3;
      local_b8.ht._0_4_ = (int)local_58.num_elements - (int)local_58.num_deleted;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_88,"3","(int)h.size()",(int *)&local_d8,(int *)&local_b8);
      sVar1 = local_88._M_string_length;
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((pointer)local_88._M_string_length == (pointer)0x0) {
          pVar3 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
        }
        else {
          pVar3 = *(pair<const_int,_int> *)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x4e,(char *)pVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_d8);
LAB_00a4c2e5:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        if ((dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)local_d8._M_head_impl !=
            (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)0x0) {
          (**(code **)(*(long *)local_d8._M_head_impl + 8))();
        }
        goto LAB_00a4be84;
      }
      if ((pointer)local_88._M_string_length != (pointer)0x0) {
        if (*(pair<const_int,_int> *)local_88._M_string_length !=
            (pair<const_int,_int>)(local_88._M_string_length + 0x10)) {
          operator_delete((void *)*(pair<const_int,_int> *)local_88._M_string_length);
        }
        operator_delete((void *)sVar1);
      }
      local_64[0] = 1;
      google::
      dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find<int>(&local_b8,&local_58,local_64);
      local_64[2] = 2;
      local_64[1] = 0;
      local_d8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(local_b8.ht._4_4_,(uint)local_b8.ht);
      ppStack_d0 = local_b8.pos;
      local_c8 = local_b8.end;
      hint_02.pos = local_b8.pos;
      hint_02.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                    *)local_d8._M_head_impl;
      hint_02.end = local_b8.end;
      google::
      dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
      ::emplace_hint<int,int,int>
                ((type *)&local_88,
                 (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                  *)&local_58,hint_02,local_64 + 2,local_64 + 1);
      local_98.data_._0_1_ = (internal)local_88.field_2._M_local_buf[8];
      local_90 = (pointer)0x0;
      if (local_88.field_2._M_local_buf[8] == 0) {
        testing::Message::Message((Message *)&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_88,(internal *)&local_98,
                   (AssertionResult *)"h.emplace_hint(h.find(1), 2, 0).second","false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x50,(char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                          local_88._M_dataplus._M_p._0_4_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_d8);
      }
      else {
        local_64[0] = 3;
        google::
        dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        ::find<int>(&local_b8,&local_58,local_64);
        local_64[2] = 4;
        local_64[1] = 0;
        local_d8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_b8.ht._4_4_,(uint)local_b8.ht);
        ppStack_d0 = local_b8.pos;
        local_c8 = local_b8.end;
        hint_03.pos = local_b8.pos;
        hint_03.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)local_d8._M_head_impl;
        hint_03.end = local_b8.end;
        google::
        dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
        ::emplace_hint<int,int,int>
                  ((type *)&local_88,
                   (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                    *)&local_58,hint_03,local_64 + 2,local_64 + 1);
        local_98.data_._0_1_ = (internal)local_88.field_2._M_local_buf[8];
        local_90 = (pointer)0x0;
        if (local_88.field_2._M_local_buf[8] != 0) {
          ppStack_d0 = local_58.table + local_58.num_buckets;
          local_98.data_._0_1_ = (internal)0x6;
          local_98.data_._1_3_ = 0;
          local_64[0] = 0;
          hint_04.pos = ppStack_d0;
          hint_04.ht = &local_58;
          hint_04.end = ppStack_d0;
          local_d8._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
          local_c8 = ppStack_d0;
          google::
          dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
          ::emplace_hint<int,int,int>
                    ((type *)&local_88,
                     (dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                      *)&local_58,hint_04,(int *)&local_98,local_64);
          local_b8.ht._0_4_ = CONCAT31(local_b8.ht._1_3_,local_88.field_2._M_local_buf[8]);
          local_b8.pos = (pointer)0x0;
          if (local_88.field_2._M_local_buf[8] == 0) {
            testing::Message::Message((Message *)&local_d8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_88,(internal *)&local_b8,
                       (AssertionResult *)"h.emplace_hint(h.end(), 6, 0).second","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                       ,0x52,(char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                              local_88._M_dataplus._M_p._0_4_));
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
            goto LAB_00a4bf97;
          }
          local_d8._M_head_impl._0_4_ = 6;
          local_b8.ht._0_4_ = (int)local_58.num_elements - (int)local_58.num_deleted;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_88,"6","(int)h.size()",(int *)&local_d8,(int *)&local_b8);
          if ((char)local_88._M_dataplus._M_p != '\0') goto LAB_00a4be84;
          testing::Message::Message((Message *)&local_d8);
          if ((pointer)local_88._M_string_length == (pointer)0x0) {
            pVar3 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
          }
          else {
            pVar3 = *(pair<const_int,_int> *)local_88._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                     ,0x53,(char *)pVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_d8)
          ;
          goto LAB_00a4c2e5;
        }
        testing::Message::Message((Message *)&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_88,(internal *)&local_98,
                   (AssertionResult *)"h.emplace_hint(h.find(3), 4, 0).second","false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x51,(char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                          local_88._M_dataplus._M_p._0_4_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_d8);
      }
    }
    else {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(internal *)&local_98,
                 (AssertionResult *)"h.emplace_hint(h.find(3), 1, 0).second","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                 ,0x4c,(char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                        local_88._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_d8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)&local_98,
               (AssertionResult *)"h.emplace_hint(h.find(1), 1, 0).second","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
               ,0x4b,(char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                      local_88._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_d8);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) !=
      &local_88.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_));
  }
  local_88._M_string_length = (size_type)local_90;
  if ((dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)local_d8._M_head_impl !=
      (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *)0x0) {
    (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    local_88._M_string_length = (size_type)local_90;
  }
LAB_00a4be84:
  if ((pointer)local_88._M_string_length != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_88._M_string_length !=
        (pair<const_int,_int>)(local_88._M_string_length + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_88._M_string_length);
    }
    operator_delete((void *)local_88._M_string_length);
  }
  if (local_58.table != (pointer)0x0) {
    free(local_58.table);
  }
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, EmplaceHint)
{
    dense_hash_map<int, int> h;
    h.set_empty_key(0);

    h[1] = 1;
    h[3] = 3;
    h[5] = 5;

    ASSERT_FALSE(h.emplace_hint(h.find(1), 1, 0).second);
    ASSERT_FALSE(h.emplace_hint(h.find(3), 1, 0).second);
    ASSERT_FALSE(h.emplace_hint(h.end(), 1, 0).second);
    ASSERT_EQ(3, (int)h.size());

    ASSERT_TRUE(h.emplace_hint(h.find(1), 2, 0).second);
    ASSERT_TRUE(h.emplace_hint(h.find(3), 4, 0).second);
    ASSERT_TRUE(h.emplace_hint(h.end(), 6, 0).second);
    ASSERT_EQ(6, (int)h.size());
}